

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O1

void __thiscall QTuioHandler::process2DCurSet(QTuioHandler *this,QOscMessage *message)

{
  long lVar1;
  QDebug QVar2;
  int iVar3;
  Stream *__old_val;
  iterator iVar4;
  long in_FS_OFFSET;
  float x;
  float y;
  float fVar5;
  float fVar6;
  float fVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  int cursorId;
  int local_94 [7];
  char *local_78;
  QDebug local_70;
  QDebug local_68;
  QtPrivate local_60 [8];
  undefined1 local_58 [16];
  ulong local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._0_8_ = (message->m_arguments).d.d;
  local_58._8_8_ = (message->m_arguments).d.ptr;
  local_48 = (message->m_arguments).d.size;
  if ((Data *)local_58._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_58._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_58._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  if (local_48 < 7) {
    lcTuioSet();
    if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      process2DCurSet((QTuioHandler *)&local_48);
    }
  }
  else {
    iVar3 = QVariant::typeId((QVariant *)(local_58._8_8_ + 0x20));
    if (iVar3 == 2) {
      iVar3 = QVariant::typeId((QVariant *)(local_58._8_8_ + 0x40));
      if (iVar3 == 0x26) {
        iVar3 = QVariant::typeId((QVariant *)(local_58._8_8_ + 0x60));
        if (iVar3 == 0x26) {
          iVar3 = QVariant::typeId((QVariant *)(local_58._8_8_ + 0x80));
          if (iVar3 == 0x26) {
            iVar3 = QVariant::typeId((QVariant *)(local_58._8_8_ + 0xa0));
            if (iVar3 == 0x26) {
              iVar3 = QVariant::typeId((QVariant *)(local_58._8_8_ + 0xc0));
              if (iVar3 == 0x26) {
                local_94[0] = QVariant::toInt((bool *)(local_58._8_8_ + 0x20));
                x = (float)QVariant::toFloat((bool *)(local_58._8_8_ + 0x40));
                y = (float)QVariant::toFloat((bool *)(local_58._8_8_ + 0x60));
                fVar5 = (float)QVariant::toFloat((bool *)(local_58._8_8_ + 0x80));
                fVar6 = (float)QVariant::toFloat((bool *)(local_58._8_8_ + 0xa0));
                fVar7 = (float)QVariant::toFloat((bool *)(local_58._8_8_ + 0xc0));
                iVar4 = QMap<int,_QTuioCursor>::find
                                  ((QMap<int,_QTuioCursor> *)(this + 0x28),local_94);
                QMap<int,_QTuioCursor>::detach((QMap<int,_QTuioCursor> *)(this + 0x28));
                lVar1 = *(long *)(this + 0x28);
                lcTuioSet();
                if (iVar4.i._M_node == (_Base_ptr)(lVar1 + 0x10)) {
                  if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i
                      & 1) != 0) {
                    process2DCurSet((QTuioHandler *)local_94);
                  }
                }
                else {
                  if (((byte)lcTuioSet::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
                      1) != 0) {
                    local_94[1] = 2;
                    local_94[2] = 0;
                    local_94[3] = 0;
                    local_94[4] = 0;
                    local_94[5] = 0;
                    local_94[6] = 0;
                    local_78 = lcTuioSet::category.name;
                    QMessageLogger::debug();
                    QVar2.stream = local_70.stream;
                    QVar8.m_data = (storage_type *)0x13;
                    QVar8.m_size = (qsizetype)&local_40;
                    QString::fromUtf8(QVar8);
                    QTextStream::operator<<((QTextStream *)QVar2.stream,&local_40);
                    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_40.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.
                              super___atomic_base<int>._M_i == '\x01') {
                      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
                    }
                    QTextStream::operator<<((QTextStream *)local_70.stream,local_94[0]);
                    if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.
                              super___atomic_base<int>._M_i == '\x01') {
                      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
                    }
                    QVar2.stream = local_70.stream;
                    QVar9.m_data = (storage_type *)0x4;
                    QVar9.m_size = (qsizetype)&local_40;
                    QString::fromUtf8(QVar9);
                    QTextStream::operator<<((QTextStream *)QVar2.stream,&local_40);
                    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_40.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.
                              super___atomic_base<int>._M_i == '\x01') {
                      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
                    }
                    QTextStream::operator<<((QTextStream *)local_70.stream,x);
                    if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.
                              super___atomic_base<int>._M_i == '\x01') {
                      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
                    }
                    QTextStream::operator<<((QTextStream *)local_70.stream,y);
                    if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.
                              super___atomic_base<int>._M_i == '\x01') {
                      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
                    }
                    QTextStream::operator<<((QTextStream *)local_70.stream,fVar5);
                    if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.
                              super___atomic_base<int>._M_i == '\x01') {
                      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
                    }
                    QTextStream::operator<<((QTextStream *)local_70.stream,fVar6);
                    if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.
                              super___atomic_base<int>._M_i == '\x01') {
                      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
                    }
                    QTextStream::operator<<((QTextStream *)local_70.stream,fVar7);
                    if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.
                              super___atomic_base<int>._M_i == '\x01') {
                      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
                    }
                    QDebug::~QDebug(&local_70);
                  }
                  QTuioCursor::setX((QTuioCursor *)((long)iVar4.i._M_node + 0x24),x);
                  QTuioCursor::setY((QTuioCursor *)((long)iVar4.i._M_node + 0x24),y);
                  *(float *)((long)iVar4.i._M_node + 0x30) = fVar5;
                  *(float *)((long)iVar4.i._M_node + 0x34) = fVar6;
                  *(float *)((long)iVar4.i._M_node + 0x38) = fVar7;
                }
                goto LAB_0010a726;
              }
            }
          }
        }
      }
    }
    lcTuioSet();
    if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_94[1] = 2;
      local_94[2] = 0;
      local_94[3] = 0;
      local_94[4] = 0;
      local_94[5] = 0;
      local_94[6] = 0;
      local_78 = lcTuioSet::category.name;
      QMessageLogger::warning();
      QVar2.stream = local_70.stream;
      QVar10.m_data = (storage_type *)0x34;
      QVar10.m_size = (qsizetype)&local_40;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<((QTextStream *)QVar2.stream,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_70.stream,' ');
      }
      *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
      local_68.stream = (Stream *)0x0;
      local_40.d.d = (Data *)local_70.stream;
      QtPrivate::printSequentialContainer<QList<QVariant>>
                (local_60,(Stream *)&local_40,"QList",(QList<QVariant> *)local_58);
      QDebug::~QDebug((QDebug *)&local_40);
      QDebug::~QDebug((QDebug *)local_60);
      QDebug::~QDebug(&local_68);
      QDebug::~QDebug(&local_70);
    }
  }
LAB_0010a726:
  QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTuioHandler::process2DCurSet(const QOscMessage &message)
{
    QList<QVariant> arguments = message.arguments();
    if (arguments.size() < 7) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with too few arguments: " << arguments.size();
        return;
    }

    if (QMetaType::Type(arguments.at(1).userType()) != QMetaType::Int   ||
        QMetaType::Type(arguments.at(2).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(3).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(4).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(5).userType()) != QMetaType::Float ||
        QMetaType::Type(arguments.at(6).userType()) != QMetaType::Float
       ) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with bad types: " << arguments;
        return;
    }

    int cursorId = arguments.at(1).toInt();
    float x = arguments.at(2).toFloat();
    float y = arguments.at(3).toFloat();
    float vx = arguments.at(4).toFloat();
    float vy = arguments.at(5).toFloat();
    float acceleration = arguments.at(6).toFloat();

    QMap<int, QTuioCursor>::Iterator it = m_activeCursors.find(cursorId);
    if (it == m_activeCursors.end()) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set for nonexistent cursor " << cursorId;
        return;
    }

    qCDebug(lcTuioSet) << "Processing SET for " << cursorId << " x: " << x << y << vx << vy << acceleration;
    QTuioCursor &cur = *it;
    cur.setX(x);
    cur.setY(y);
    cur.setVX(vx);
    cur.setVY(vy);
    cur.setAcceleration(acceleration);
}